

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

uint32_t helper_clcl(CPUS390XState_conflict *env,uint32_t r1,uint32_t r2)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint32_t uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  uintptr_t unaff_retaddr;
  target_ulong local_70;
  target_ulong local_68;
  uint32_t uVar4;
  
  uVar9 = r1 + 1;
  uVar13 = (ulong)((uint)env->regs[uVar9] & 0xffffff);
  lVar8 = (long)(int)r1;
  local_68 = env->regs[lVar8];
  uVar10 = (env->psw).mask;
  if ((uVar10 >> 0x20 & 1) == 0) {
    if ((int)uVar10 < 0) {
      local_68 = (target_ulong)((uint)local_68 & 0x7fffffff);
    }
    else {
      local_68 = (target_ulong)((uint)local_68 & 0xffffff);
    }
  }
  uVar11 = r2 + 1;
  uVar12 = (ulong)((uint)env->regs[uVar11] & 0xffffff);
  lVar7 = (long)(int)r2;
  local_70 = env->regs[lVar7];
  if ((uVar10 & 0x100000000) == 0) {
    if ((int)uVar10 < 0) {
      local_70 = (target_ulong)((uint)local_70 & 0x7fffffff);
    }
    else {
      local_70 = (target_ulong)((uint)local_70 & 0xffffff);
    }
  }
  uVar10 = uVar12;
  if (uVar12 < uVar13) {
    uVar10 = uVar13;
  }
  if (uVar10 == 0) {
    uVar5 = 0;
  }
  else {
    bVar1 = (byte)(env->regs[uVar11] >> 0x18);
    uVar5 = 0;
    do {
      uVar10 = uVar10 - 1;
      uVar2 = (ushort)bVar1;
      if (uVar13 != 0) {
        uVar4 = cpu_ldub_data_ra_s390x(env,local_68,unaff_retaddr);
        uVar2 = (ushort)uVar4;
      }
      uVar3 = (ushort)bVar1;
      if (uVar12 != 0) {
        uVar4 = cpu_ldub_data_ra_s390x(env,local_70,unaff_retaddr);
        uVar3 = (ushort)uVar4;
      }
      if (uVar2 == uVar3) {
        bVar14 = uVar13 == 0;
        uVar6 = uVar13 - 1;
        uVar13 = 0;
        if (!bVar14) {
          uVar13 = uVar6;
        }
        local_68 = (local_68 + 1) - (ulong)bVar14;
        if (uVar12 != 0) {
          local_70 = local_70 + 1;
          uVar12 = uVar12 - 1;
        }
      }
      else {
        uVar5 = 2 - (uVar2 < uVar3);
      }
    } while ((uVar2 == uVar3) && (uVar10 != 0));
    uVar13 = uVar13 & 0xffffff;
    uVar12 = uVar12 & 0xffffff;
  }
  env->regs[uVar9] = env->regs[uVar9] & 0xffffffffff000000 | uVar13;
  env->regs[uVar11] = env->regs[uVar11] & 0xffffffffff000000 | uVar12;
  uVar10 = (env->psw).mask;
  if ((uVar10 & 0x100000000) == 0) {
    if ((int)uVar10 < 0) {
      uVar9 = (uint)local_68 & 0x7fffffff;
      uVar10 = (ulong)*(uint *)((long)env->regs + lVar8 * 8 + 4) << 0x20;
    }
    else {
      uVar10 = env->regs[lVar8] & 0xffffffffff000000;
      uVar9 = (uint)local_68 & 0xffffff;
    }
    local_68 = uVar9 | uVar10;
  }
  env->regs[lVar8] = local_68;
  uVar10 = (env->psw).mask;
  if ((uVar10 & 0x100000000) == 0) {
    if ((int)uVar10 < 0) {
      uVar9 = (uint)local_70 & 0x7fffffff;
      uVar10 = (ulong)*(uint *)((long)env->regs + lVar7 * 8 + 4) << 0x20;
    }
    else {
      uVar10 = env->regs[lVar7] & 0xffffffffff000000;
      uVar9 = (uint)local_70 & 0xffffff;
    }
    local_70 = uVar9 | uVar10;
  }
  env->regs[lVar7] = local_70;
  return uVar5;
}

Assistant:

uint32_t HELPER(clcl)(CPUS390XState *env, uint32_t r1, uint32_t r2)
{
    uintptr_t ra = GETPC();
    uint64_t src1len = extract64(env->regs[r1 + 1], 0, 24);
    uint64_t src1 = get_address(env, r1);
    uint64_t src3len = extract64(env->regs[r2 + 1], 0, 24);
    uint64_t src3 = get_address(env, r2);
    uint8_t pad = env->regs[r2 + 1] >> 24;
    uint32_t cc;

    cc = do_clcl(env, &src1, &src1len, &src3, &src3len, pad, -1, 1, ra);

    env->regs[r1 + 1] = deposit64(env->regs[r1 + 1], 0, 24, src1len);
    env->regs[r2 + 1] = deposit64(env->regs[r2 + 1], 0, 24, src3len);
    set_address(env, r1, src1);
    set_address(env, r2, src3);

    return cc;
}